

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int32_t zng_inflateUndermine(zng_stream *strm,int32_t subvert)

{
  return -3;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateUndermine)(PREFIX3(stream) *strm, int32_t subvert) {
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
    struct inflate_state *state;

    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;
    state->sane = !subvert;
    return Z_OK;
#else
    Z_UNUSED(strm);
    Z_UNUSED(subvert);
    return Z_DATA_ERROR;
#endif
}